

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * google::protobuf::compiler::objectivec::anon_unknown_0::SanitizeNameForObjC
                   (string *__return_storage_ptr__,string_view prefix,string_view input,
                   string_view extension,string *out_suffix_added)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *prVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  AlphaNum *this;
  string sanitized;
  AlphaNum local_c0;
  char *word;
  char *pcStack_88;
  string_view input_local;
  
  pcVar8 = input._M_str;
  pcVar5 = (char *)input._M_len;
  pcVar7 = (char *)prefix._M_len;
  sanitized._M_dataplus._M_p = (pointer)&sanitized.field_2;
  sanitized._M_string_length = 0;
  sanitized.field_2._M_local_buf[0] = '\0';
  input_local._M_len = (size_t)pcVar5;
  input_local._M_str = pcVar8;
  bVar1 = absl::lts_20240722::StartsWith(input,prefix);
  if (bVar1) {
    if ((pcVar5 == pcVar7) || (0x19 < (byte)(pcVar8[(long)pcVar7] + 0xbfU))) {
      local_c0.piece_._M_len = (size_t)pcVar7;
      local_c0.piece_._M_str = prefix._M_str;
      word = pcVar5;
      pcStack_88 = pcVar8;
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&stack0xffffffffffffffb0,&local_c0);
      goto LAB_00267d55;
    }
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_c0,&input_local,(allocator<char> *)&word);
    this = &local_c0;
  }
  else {
    local_c0.piece_._M_len = (size_t)pcVar7;
    local_c0.piece_._M_str = prefix._M_str;
    word = pcVar5;
    pcStack_88 = pcVar8;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&stack0xffffffffffffffb0,&local_c0);
LAB_00267d55:
    this = (AlphaNum *)&stack0xffffffffffffffb0;
  }
  std::__cxx11::string::operator=((string *)&sanitized,(string *)this);
  std::__cxx11::string::~string((string *)this);
  local_c0.piece_._M_len = sanitized._M_string_length;
  local_c0.piece_._M_str = sanitized._M_dataplus._M_p;
  if (sanitized._M_string_length < 3) {
LAB_00267dc8:
    if ((anonymous_namespace)::ReservedWords()::words == '\0') {
      iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::ReservedWords()::words);
      if (iVar2 != 0) {
        prVar4 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)operator_new(0x20);
        *(undefined8 *)prVar4 = 1;
        *(undefined8 *)(prVar4 + 8) = 0;
        for (lVar6 = 0; lVar6 != 0x4a8; lVar6 = lVar6 + 8) {
          word = *(char **)((long)&(anonymous_namespace)::kReservedWordList + lVar6);
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::emplace<const_char_*const_&,_0>
                    ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                      *)&local_c0,
                     (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)prVar4,&word);
        }
        (anonymous_namespace)::ReservedWords()::words = prVar4;
        __cxa_guard_release(&(anonymous_namespace)::ReservedWords()::words);
      }
    }
    bVar1 = absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::contains<std::__cxx11::string>
                      ((anonymous_namespace)::ReservedWords()::words,&sanitized);
    if (!bVar1) {
      if ((anonymous_namespace)::NSObjectMethods()::words == '\0') {
        iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::NSObjectMethods()::words);
        if (iVar2 != 0) {
          prVar4 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)operator_new(0x20);
          *(undefined8 *)prVar4 = 1;
          *(undefined8 *)(prVar4 + 8) = 0;
          for (lVar6 = 0; lVar6 != 0x5c8; lVar6 = lVar6 + 8) {
            word = *(char **)((long)kNSObjectMethodsList + lVar6);
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::emplace<const_char_*const_&,_0>
                      ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                        *)&local_c0,
                       (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)prVar4,&word);
          }
          (anonymous_namespace)::NSObjectMethods()::words = prVar4;
          __cxa_guard_release(&(anonymous_namespace)::NSObjectMethods()::words);
        }
      }
      bVar1 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::contains<std::__cxx11::string>
                        ((anonymous_namespace)::NSObjectMethods()::words,&sanitized);
      if (!bVar1) {
        if (out_suffix_added != (string *)0x0) {
          out_suffix_added->_M_string_length = 0;
          *(out_suffix_added->_M_dataplus)._M_p = '\0';
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sanitized._M_dataplus._M_p == &sanitized.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(sanitized.field_2._M_allocated_capacity._1_7_,
                        sanitized.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = sanitized.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = sanitized._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(sanitized.field_2._M_allocated_capacity._1_7_,
                        sanitized.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = sanitized._M_string_length;
        sanitized._M_string_length = 0;
        sanitized.field_2._M_local_buf[0] = '\0';
        sanitized._M_dataplus._M_p = (pointer)&sanitized.field_2;
        goto LAB_00267e73;
      }
    }
  }
  else {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::at(&local_c0.piece_,0);
    if (*pvVar3 != '_') goto LAB_00267dc8;
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::at(&local_c0.piece_,1);
    iVar2 = isupper((int)*pvVar3);
    if (iVar2 == 0) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::at(&local_c0.piece_,1);
      if (*pvVar3 != '_') goto LAB_00267dc8;
    }
  }
  if (out_suffix_added != (string *)0x0) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_c0,&extension,(allocator<char> *)&word);
    std::__cxx11::string::operator=((string *)out_suffix_added,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  local_c0.piece_._M_len = sanitized._M_string_length;
  local_c0.piece_._M_str = sanitized._M_dataplus._M_p;
  word = (char *)extension._M_len;
  pcStack_88 = extension._M_str;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_c0);
LAB_00267e73:
  std::__cxx11::string::~string((string *)&sanitized);
  return __return_storage_ptr__;
}

Assistant:

std::string SanitizeNameForObjC(absl::string_view prefix,
                                absl::string_view input,
                                absl::string_view extension,
                                std::string* out_suffix_added) {
  std::string sanitized;
  // We add the prefix in the cases where the string is missing a prefix.
  // We define "missing a prefix" as where 'input':
  // a) Doesn't start with the prefix or
  // b) Isn't equivalent to the prefix or
  // c) Has the prefix, but the letter after the prefix is lowercase
  if (absl::StartsWith(input, prefix)) {
    if (input.length() == prefix.length() ||
        !absl::ascii_isupper(input[prefix.length()])) {
      sanitized = absl::StrCat(prefix, input);
    } else {
      sanitized = std::string(input);
    }
  } else {
    sanitized = absl::StrCat(prefix, input);
  }
  if (IsReservedCIdentifier(sanitized) || ReservedWords().contains(sanitized) ||
      NSObjectMethods().contains(sanitized)) {
    if (out_suffix_added) *out_suffix_added = std::string(extension);
    return absl::StrCat(sanitized, extension);
  }
  if (out_suffix_added) out_suffix_added->clear();
  return sanitized;
}